

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexture2DShadow(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float *pfVar1;
  float fVar2;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  pfVar1 = tcu::Vector<float,_4>::z(c->in);
  fVar2 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::x(c->in);
  s = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::y(c->in);
  fVar2 = texture2DShadow(c,fVar2,s,*pfVar1,p->lod);
  pfVar1 = tcu::Vector<float,_4>::x(&c->color);
  *pfVar1 = fVar2;
  return;
}

Assistant:

static void		evalTexture2DShadow				(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DShadow(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), p.lod); }